

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleCustomizationsFactory.cpp
# Opt level: O3

ComparatorContainer *
ApprovalTests::GoogleCustomizationsFactory::comparatorContainer_abi_cxx11_(void)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if (comparatorContainer[abi:cxx11]()::container_abi_cxx11_ == '\0') {
    comparatorContainer_abi_cxx11_();
  }
  if (comparatorContainer[abi:cxx11]()::container_abi_cxx11_.
      super__Vector_base<std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      comparatorContainer[abi:cxx11]()::container_abi_cxx11_.
      super__Vector_base<std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    local_10 = ::std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/integrations/google/GoogleCustomizationsFactory.cpp:11:38)>
               ::_M_invoke;
    local_18 = ::std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/integrations/google/GoogleCustomizationsFactory.cpp:11:38)>
               ::_M_manager;
    ::std::
    vector<std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>>>
    ::emplace_back<std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>>
              ((vector<std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>>>
                *)&comparatorContainer[abi:cxx11]()::container_abi_cxx11_,
               (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
  }
  return &comparatorContainer[abi:cxx11]()::container_abi_cxx11_;
}

Assistant:

GoogleCustomizationsFactory::ComparatorContainer&
    GoogleCustomizationsFactory::comparatorContainer()
    {
        static ComparatorContainer container;
        if (container.empty())
        {
            auto exactNameMatching = [](const std::string& testFileNameWithExtension,
                                        const std::string& testCaseName) {
                return StringUtils::contains(testFileNameWithExtension,
                                             testCaseName + ".");
            };
            container.push_back(exactNameMatching);
        }
        return container;
    }